

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Triplets.h
# Opt level: O0

void __thiscall
iDynTree::Triplets::addSubMatrix<6u,6u>
          (Triplets *this,size_t startingRow,size_t startingColumn,MatrixFixSize<6U,_6U> *matrix)

{
  vector<iDynTree::Triplet,_std::allocator<iDynTree::Triplet>_> *this_00;
  size_t row_00;
  long in_RDX;
  long in_RSI;
  MatrixFixSize<6U,_6U> *in_RDI;
  double dVar1;
  size_t col;
  size_t row;
  value_type *in_stack_ffffffffffffff98;
  Triplet local_48 [16];
  size_type in_stack_ffffffffffffffc8;
  vector<iDynTree::Triplet,_std::allocator<iDynTree::Triplet>_> *in_stack_ffffffffffffffd0;
  ulong uVar2;
  ulong local_28;
  
  std::vector<iDynTree::Triplet,_std::allocator<iDynTree::Triplet>_>::size
            ((vector<iDynTree::Triplet,_std::allocator<iDynTree::Triplet>_> *)in_RDI);
  std::vector<iDynTree::Triplet,_std::allocator<iDynTree::Triplet>_>::reserve
            (in_stack_ffffffffffffffd0,in_stack_ffffffffffffffc8);
  for (local_28 = 0; local_28 < 6; local_28 = local_28 + 1) {
    for (uVar2 = 0; uVar2 < 6; uVar2 = uVar2 + 1) {
      this_00 = (vector<iDynTree::Triplet,_std::allocator<iDynTree::Triplet>_> *)(in_RSI + local_28)
      ;
      row_00 = in_RDX + uVar2;
      dVar1 = MatrixFixSize<6U,_6U>::operator()(in_RDI,row_00,(size_t)this_00);
      iDynTree::Triplet::Triplet(local_48,(ulong)this_00,row_00,dVar1);
      std::vector<iDynTree::Triplet,_std::allocator<iDynTree::Triplet>_>::push_back
                (this_00,in_stack_ffffffffffffff98);
    }
  }
  return;
}

Assistant:

inline void addSubMatrix(std::size_t startingRow,
                             std::size_t startingColumn,
                             const MatrixFixSize<rows, cols> &matrix)
    {
        //if enough memory has been reserved this should be a noop
        m_triplets.reserve(m_triplets.size() + (rows * cols));
        for (std::size_t row = 0; row < rows; ++row) {
            for (std::size_t col = 0; col < cols; ++col) {
                m_triplets.push_back(Triplet(startingRow + row, startingColumn + col, matrix(row, col)));
            }
        }
    }